

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNsInScope(xmlDocPtr doc,xmlNodePtr node,xmlNodePtr ancestor,xmlChar *prefix)

{
  int iVar1;
  xmlNs *local_38;
  xmlNsPtr tst;
  xmlChar *prefix_local;
  xmlNodePtr ancestor_local;
  xmlNodePtr node_local;
  xmlDocPtr doc_local;
  
  ancestor_local = node;
  do {
    if (ancestor_local == (xmlNodePtr)0x0 || ancestor_local == ancestor) {
      if (ancestor_local == ancestor) {
        doc_local._4_4_ = 1;
      }
      else {
        doc_local._4_4_ = -1;
      }
      return doc_local._4_4_;
    }
    if ((ancestor_local->type == XML_ENTITY_REF_NODE) || (ancestor_local->type == XML_ENTITY_DECL))
    {
      return -1;
    }
    if (ancestor_local->type == XML_ELEMENT_NODE) {
      for (local_38 = ancestor_local->nsDef; local_38 != (xmlNs *)0x0; local_38 = local_38->next) {
        if ((local_38->prefix == (xmlChar *)0x0) && (prefix == (xmlChar *)0x0)) {
          return 0;
        }
        if (((local_38->prefix != (xmlChar *)0x0) && (prefix != (xmlChar *)0x0)) &&
           (iVar1 = xmlStrEqual(local_38->prefix,prefix), iVar1 != 0)) {
          return 0;
        }
      }
    }
    ancestor_local = ancestor_local->parent;
  } while( true );
}

Assistant:

static int
xmlNsInScope(xmlDocPtr doc ATTRIBUTE_UNUSED, xmlNodePtr node,
             xmlNodePtr ancestor, const xmlChar * prefix)
{
    xmlNsPtr tst;

    while ((node != NULL) && (node != ancestor)) {
        if ((node->type == XML_ENTITY_REF_NODE) ||
            (node->type == XML_ENTITY_DECL))
            return (-1);
        if (node->type == XML_ELEMENT_NODE) {
            tst = node->nsDef;
            while (tst != NULL) {
                if ((tst->prefix == NULL)
                    && (prefix == NULL))
                    return (0);
                if ((tst->prefix != NULL)
                    && (prefix != NULL)
                    && (xmlStrEqual(tst->prefix, prefix)))
                    return (0);
                tst = tst->next;
            }
        }
        node = node->parent;
    }
    if (node != ancestor)
        return (-1);
    return (1);
}